

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

HalfEdge * __thiscall MeshLib::Vertex::most_ccw_in_halfedge(Vertex *this)

{
  HalfEdge *local_20;
  HalfEdge *he;
  Vertex *this_local;
  
  if ((this->m_boundary & 1U) == 0) {
    this_local = (Vertex *)this->m_halfedge;
  }
  else {
    local_20 = HalfEdge::ccw_rotate_about_target(this->m_halfedge);
    while (local_20 != (HalfEdge *)0x0) {
      this->m_halfedge = local_20;
      local_20 = HalfEdge::ccw_rotate_about_target(this->m_halfedge);
    }
    this_local = (Vertex *)this->m_halfedge;
  }
  return (HalfEdge *)this_local;
}

Assistant:

HalfEdge *  Vertex::most_ccw_in_halfedge()  
{ 
	if( !m_boundary )
	{
		return m_halfedge; //current half edge is the most ccw in halfedge 
	}

	HalfEdge * he = m_halfedge->ccw_rotate_about_target();
	
	while( he != NULL )
	{
		m_halfedge = he;
		he = m_halfedge->ccw_rotate_about_target();
	}

	return m_halfedge;
}